

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O2

ConfusionMatrix<int,_0> * __thiscall
notch::metrics::AClassifier<int,_0>::test
          (ConfusionMatrix<int,_0> *__return_storage_ptr__,AClassifier<int,_0> *this,
          LabeledDataset *testSet)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  int predicted;
  int actual;
  DatasetIterator __end3;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  p_Var1 = &(__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->cm)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70._0_8_ =
       (testSet->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_70._8_8_ =
       (testSet->inputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60._0_8_ =
       (testSet->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60._8_8_ =
       (testSet->outputs).
       super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50._8_4_ = (undefined4)local_70._8_8_;
  local_50._12_4_ = (undefined4)((ulong)local_70._8_8_ >> 0x20);
  local_50._0_8_ = local_70._8_8_;
  local_40._8_4_ = (int)local_60._8_8_;
  local_40._0_8_ = local_60._8_8_;
  local_40._12_4_ = (int)((ulong)local_60._8_8_ >> 0x20);
  while( true ) {
    bVar3 = core::LabeledDataset::DatasetIterator::operator!=
                      ((DatasetIterator *)local_70,(DatasetIterator *)local_50);
    if (!bVar3) break;
    uVar2 = local_60._0_8_;
    predicted = (*this->_vptr_AClassifier[1])(this,local_70._0_8_);
    actual = (**this->_vptr_AClassifier)(this,uVar2);
    ConfusionMatrix<int,_0>::add(__return_storage_ptr__,actual,predicted);
    if ((local_70._0_8_ != local_70._8_8_) && (local_60._0_8_ != local_60._8_8_)) {
      local_70._0_8_ = (valarray<float> *)(local_70._0_8_ + 0x10);
      local_60._0_8_ = (valarray<float> *)(local_60._0_8_ + 0x10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual ConfusionMatrix<C, default_class> test(const LabeledDataset &testSet) {
		ConfusionMatrix<C, default_class> cm;
		for (LabeledData sample : testSet) {
			C predicted = classify(sample.data);
			C actual = aslabel(sample.label);
			cm.add(actual, predicted);
		}
		return cm;
	}